

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O2

rel_iterator * __thiscall
dg::vr::ValueRelations::begin_related
          (rel_iterator *__return_storage_ptr__,ValueRelations *this,V val,Relations *rels)

{
  const_iterator cVar1;
  V local_20;
  
  local_20 = val;
  cVar1 = std::
          _Rb_tree<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::_Select1st<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
          ::find(&(this->valToBucket)._M_t,&local_20);
  RelatedValueIterator::RelatedValueIterator
            (__return_storage_ptr__,this,(Handle)cVar1._M_node[1]._M_parent,rels);
  return __return_storage_ptr__;
}

Assistant:

ValueRelations::rel_iterator
ValueRelations::begin_related(V val, const Relations &rels) const {
    assert(valToBucket.find(val) != valToBucket.end());
    Handle h = valToBucket.find(val)->second;
    return {*this, h, rels};
}